

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

int __thiscall
pg::PSISolver::switch_strategy
          (PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int pl,int begin,int count)

{
  long lVar1;
  Game *pGVar2;
  bitset *pbVar3;
  Worker *pWVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  Error *this_00;
  uint uVar9;
  uint b;
  uint a;
  PSISolver *this_01;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  TD_switch_strategy *t;
  int local_5c;
  
  if (count < 0x40) {
    local_5c = 0;
    for (uVar12 = 0; uVar12 != (uint)(~(count >> 0x1f) & count); uVar12 = uVar12 + 1) {
      lVar1 = uVar12 + (long)begin;
      iVar8 = *(int *)(done + lVar1 * 4);
      if (iVar8 != 3) {
        if (iVar8 == 0) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                       ,0x145);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        this_01 = this;
        iVar8 = Solver::owner(&this->super_Solver,(int)lVar1);
        lVar6 = halt;
        lVar5 = str;
        if (iVar8 == pl) {
          pGVar2 = (this->super_Solver).game;
          pbVar3 = (this->super_Solver).disabled;
          uVar13 = *(uint *)(str + lVar1 * 4);
          puVar11 = (uint *)(pGVar2->_outedges + pGVar2->_firstouts[lVar1]);
          while( true ) {
            uVar9 = *puVar11;
            uVar10 = (ulong)(int)uVar9;
            if (uVar10 == 0xffffffffffffffff) break;
            if (((pbVar3->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) && (uVar9 != uVar13)) {
              if (pl == 0) {
                a = -(uint)(*(int *)(lVar6 + (long)(int)uVar13 * 4) != 0) | uVar13;
                b = -(uint)(*(int *)(lVar6 + uVar10 * 4) != 0) | uVar9;
              }
              else {
                a = -(uint)(*(int *)(lVar6 + uVar10 * 4) != 0) | uVar9;
                b = -(uint)(*(int *)(lVar6 + (long)(int)uVar13 * 4) != 0) | uVar13;
              }
              bVar7 = si_val_less(this_01,a,b);
              if (bVar7) {
                local_5c = local_5c + 1;
                *(uint *)(lVar5 + lVar1 * 4) = uVar9;
                uVar13 = uVar9;
              }
            }
            puVar11 = puVar11 + 1;
          }
        }
      }
    }
  }
  else {
    if (__lace_worker->end == __lace_dq_head) {
      lace_abort_stack_overflow();
    }
    uVar13 = (uint)count >> 1;
    __lace_dq_head->f = switch_strategy_WRAP;
    (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
    *(PSISolver **)__lace_dq_head->d = this;
    *(int *)(__lace_dq_head->d + 8) = pl;
    *(uint *)(__lace_dq_head->d + 0xc) = uVar13 + begin;
    *(uint *)(__lace_dq_head->d + 0x10) = count - uVar13;
    pWVar4 = __lace_worker->_public;
    if (__lace_worker->allstolen == '\0') {
      if (pWVar4->movesplit != '\0') {
        uVar9 = (uint)((int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6) + 2 +
                      (int)((ulong)((long)__lace_worker->split - (long)__lace_worker->dq) >> 6)) >>
                1;
        LOCK();
        *(uint *)((long)&pWVar4->ts + 4) = uVar9;
        UNLOCK();
        __lace_worker->split = __lace_worker->dq + uVar9;
        pWVar4->movesplit = '\0';
      }
    }
    else {
      if (pWVar4->movesplit != '\0') {
        pWVar4->movesplit = '\0';
      }
      uVar12 = (long)__lace_dq_head - (long)__lace_worker->dq;
      LOCK();
      pWVar4->ts = (TailSplit)
                   ((uVar12 >> 6 & 0xffffffff | (uVar12 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                   );
      UNLOCK();
      pWVar4->allstolen = '\0';
      __lace_worker->split = __lace_dq_head + 1;
      __lace_worker->allstolen = '\0';
    }
    iVar8 = switch_strategy(this,__lace_worker,__lace_dq_head + 1,pl,begin,uVar13);
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= __lace_dq_head)) {
      (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
      local_5c = switch_strategy(*(PSISolver **)__lace_dq_head->d,__lace_worker,__lace_dq_head,
                                 *(int *)(__lace_dq_head->d + 8),*(int *)(__lace_dq_head->d + 0xc),
                                 *(int *)(__lace_dq_head->d + 0x10));
    }
    else {
      local_5c = switch_strategy_SYNC_SLOW(__lace_worker,__lace_dq_head);
    }
    local_5c = local_5c + iVar8;
  }
  return local_5c;
}

Assistant:

int
PSISolver::switch_strategy(WorkerP* __lace_worker, Task* __lace_dq_head, int pl, int begin, int count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;

            if (done[n] == 3) continue; // skip "disabled or won"
            if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
            if (owner(n) != pl) continue; // only change strategy if owner

            int cur_strat = str[n];
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue; // skip strategy to disabled
                if (to == cur_strat) continue; // skip strategy to same
                if (pl == 0) {
                    // improving for player Even
                    if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                } else {
                    // improving for player Odd
                    if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                }
            }
        }
        return res;
    } else {
        SPAWN(switch_strategy, this, pl, begin+count/2, count-count/2);
        int res = CALL(switch_strategy, this, pl, begin, count/2);
        res += SYNC(switch_strategy);
        return res;
    }
}